

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddReord.c
# Opt level: O0

int cuddZddSwapping(DdManager *table,int lower,int upper,Cudd_ReorderingType heuristic)

{
  uint uVar1;
  Move *pMVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  int result;
  int modulo;
  int pivot;
  Move *move;
  Move *moves;
  int previousSize;
  int iterate;
  int y;
  int x;
  int nvars;
  int keys;
  int max;
  int j;
  int i;
  Cudd_ReorderingType heuristic_local;
  int upper_local;
  int lower_local;
  DdManager *table_local;
  
  result = -1;
  iVar3 = (upper - lower) + 1;
  max = 0;
  while( true ) {
    if (iVar3 <= max) {
      return 1;
    }
    if (heuristic == CUDD_REORDER_RANDOM_PIVOT) {
      nvars = -1;
      for (keys = lower; keys <= upper; keys = keys + 1) {
        uVar1 = table->subtableZ[keys].keys;
        if (nvars < (int)uVar1) {
          result = keys;
          nvars = uVar1;
        }
      }
      if (upper - result == 0) {
        previousSize = result;
      }
      else {
        lVar5 = Cudd_Random();
        previousSize = result + 1 + (int)(lVar5 % (long)(upper - result));
      }
      iVar4 = (result - lower) + -1;
      iterate = lower;
      if (0 < iVar4) {
        do {
          uVar6 = Cudd_Random();
          iterate = (int)((long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff) %
                         (long)iVar4);
        } while (iterate == previousSize);
      }
    }
    else {
      lVar5 = Cudd_Random();
      iterate = (int)(lVar5 % (long)iVar3) + lower;
      do {
        lVar5 = Cudd_Random();
        previousSize = (int)(lVar5 % (long)iVar3) + lower;
      } while (iterate == previousSize);
    }
    uVar1 = table->keysZ;
    move = zddSwapAny(table,iterate,previousSize);
    if ((move == (Move *)0x0) || (iVar4 = cuddZddSiftingBackward(table,move,uVar1), iVar4 == 0))
    break;
    while (move != (Move *)0x0) {
      pMVar2 = move->next;
      move->y = 0;
      *(DdNode **)&move->flags = table->nextFree;
      table->nextFree = (DdNode *)move;
      move = pMVar2;
    }
    max = max + 1;
  }
  while (move != (Move *)0x0) {
    pMVar2 = move->next;
    move->y = 0;
    *(DdNode **)&move->flags = table->nextFree;
    table->nextFree = (DdNode *)move;
    move = pMVar2;
  }
  return 0;
}

Assistant:

int
cuddZddSwapping(
  DdManager * table,
  int lower,
  int upper,
  Cudd_ReorderingType heuristic)
{
    int i, j;
    int max, keys;
    int nvars;
    int x, y;
    int iterate;
    int previousSize;
    Move *moves, *move;
    int pivot = -1;
    int modulo;
    int result;

#ifdef DD_DEBUG
    /* Sanity check */
    assert(lower >= 0 && upper < table->sizeZ && lower <= upper);
#endif

    nvars = upper - lower + 1;
    iterate = nvars;

    for (i = 0; i < iterate; i++) {
        if (heuristic == CUDD_REORDER_RANDOM_PIVOT) {
            /* Find pivot <= id with maximum keys. */
            for (max = -1, j = lower; j <= upper; j++) {
                if ((keys = table->subtableZ[j].keys) > max) {
                    max = keys;
                    pivot = j;
                }
            }

            modulo = upper - pivot;
            if (modulo == 0) {
                y = pivot;      /* y = nvars-1 */
            } else {
                /* y = random # from {pivot+1 .. nvars-1} */
                y = pivot + 1 + (int) (Cudd_Random() % modulo);
            }

            modulo = pivot - lower - 1;
            if (modulo < 1) {   /* if pivot = 1 or 0 */
                x = lower;
            } else {
                do { /* x = random # from {0 .. pivot-2} */
                    x = (int) Cudd_Random() % modulo;
                } while (x == y);
                  /* Is this condition really needed, since x and y
                     are in regions separated by pivot? */
            }
        } else {
            x = (int) (Cudd_Random() % nvars) + lower;
            do {
                y = (int) (Cudd_Random() % nvars) + lower;
            } while (x == y);
        }

        previousSize = table->keysZ;
        moves = zddSwapAny(table, x, y);
        if (moves == NULL)
            goto cuddZddSwappingOutOfMem;

        result = cuddZddSiftingBackward(table, moves, previousSize);
        if (!result)
            goto cuddZddSwappingOutOfMem;

        while (moves != NULL) {
            move = moves->next;
            cuddDeallocMove(table, moves);
            moves = move;
        }
#ifdef DD_STATS
        if (table->keysZ < (unsigned) previousSize) {
            (void) fprintf(table->out,"-");
        } else if (table->keysZ > (unsigned) previousSize) {
            (void) fprintf(table->out,"+");     /* should never happen */
        } else {
            (void) fprintf(table->out,"=");
        }
        fflush(table->out);
#endif
    }

    return(1);

cuddZddSwappingOutOfMem:
    while (moves != NULL) {
        move = moves->next;
        cuddDeallocMove(table, moves);
        moves = move;
    }
    return(0);

}